

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::RandCaseItemSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RandCaseItemSyntax *this,size_t index)

{
  Info *pIVar1;
  __index_type _Var2;
  StatementSyntax *pSVar3;
  
  if (index == 2) {
    pSVar3 = (this->statement).ptr;
LAB_005a9562:
    *(StatementSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pSVar3;
    _Var2 = '\x01';
  }
  else {
    if (index == 1) {
      pIVar1 = (this->colon).info;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           *(undefined8 *)&this->colon;
      *(Info **)((long)&(__return_storage_ptr__->
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 8) = pIVar1;
    }
    else {
      if (index == 0) {
        pSVar3 = (StatementSyntax *)(this->expr).ptr;
        goto LAB_005a9562;
      }
      parsing::Token::Token((Token *)__return_storage_ptr__);
    }
    _Var2 = '\0';
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RandCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return expr.get();
        case 1: return colon;
        case 2: return statement.get();
        default: return nullptr;
    }
}